

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,TypeCast *c)

{
  TypeCast *expr;
  bool bVar1;
  size_t sVar2;
  Type *targetType;
  CommaSeparatedList *list_00;
  Expression *pEVar3;
  Constant *pCVar4;
  bool local_149;
  undefined1 local_108 [8];
  Value castValue;
  pool_ptr<soul::AST::Constant> cv;
  Type local_b8;
  uint local_9c;
  pool_ref<soul::AST::Expression> local_98;
  pool_ptr<soul::AST::CommaSeparatedList> local_90;
  pool_ptr<soul::AST::CommaSeparatedList> list;
  Type local_78;
  Value local_60;
  TypeCast *local_20;
  TypeCast *c_local;
  ConstantFolder *this_local;
  
  local_20 = c;
  c_local = (TypeCast *)this;
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,c);
  bVar1 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    (&this->super_ErrorIgnoringRewritingASTVisitor,&local_20->super_Expression);
  if (bVar1) {
    return &local_20->super_Expression;
  }
  sVar2 = AST::TypeCast::getNumArguments(local_20);
  if (sVar2 == 0) {
    pEVar3 = &local_20->super_Expression;
    Type::Type(&local_78,&local_20->targetType);
    soul::Value::zeroInitialiser(&local_60,&local_78);
    this_local = (ConstantFolder *)
                 createConstant(this,&(pEVar3->super_Statement).super_ASTObject.context,&local_60);
    soul::Value::~Value(&local_60);
    Type::~Type(&local_78);
    return (Expression *)this_local;
  }
  local_98.object = (local_20->source).object;
  cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&local_90,&local_98);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_98);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_90);
  expr = local_20;
  if (bVar1) {
    targetType = &local_20->targetType;
    list_00 = pool_ptr<soul::AST::CommaSeparatedList>::operator*(&local_90);
    this_local = (ConstantFolder *)
                 convertExpressionListToConstant(this,&expr->super_Expression,targetType,list_00);
  }
  local_9c = (uint)bVar1;
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_90);
  if (local_9c != 0) {
    return (Expression *)this_local;
  }
  pEVar3 = pool_ref<soul::AST::Expression>::get(&local_20->source);
  bVar1 = AST::isResolvedAsValue(pEVar3);
  local_149 = false;
  if (bVar1) {
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_20->source);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])();
    local_149 = Type::isIdentical(&local_b8,&local_20->targetType);
    Type::~Type(&local_b8);
  }
  if (local_149 != false) {
    pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_20->source);
    return pEVar3;
  }
  pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_20->source);
  (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
            (castValue.allocatedData.allocatedData.space);
  bVar1 = soul::pool_ptr::operator_cast_to_bool
                    ((pool_ptr *)castValue.allocatedData.allocatedData.space);
  if (bVar1) {
    pCVar4 = pool_ptr<soul::AST::Constant>::operator->
                       ((pool_ptr<soul::AST::Constant> *)castValue.allocatedData.allocatedData.space
                       );
    soul::Value::tryCastToType((Value *)local_108,&pCVar4->value,&local_20->targetType);
    bVar1 = soul::Value::isValid((Value *)local_108);
    if (bVar1) {
      this_local = (ConstantFolder *)
                   AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                             ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                              &(local_20->super_Expression).super_Statement.super_ASTObject.context,
                              (Value *)local_108);
    }
    local_9c = (uint)bVar1;
    soul::Value::~Value((Value *)local_108);
    if (local_9c != 0) goto LAB_003c8eaa;
  }
  local_9c = 0;
LAB_003c8eaa:
  pool_ptr<soul::AST::Constant>::~pool_ptr
            ((pool_ptr<soul::AST::Constant> *)castValue.allocatedData.allocatedData.space);
  if (local_9c == 0) {
    this_local = (ConstantFolder *)local_20;
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::TypeCast& c) override
        {
            super::visit (c);

            if (failIfNotResolved (c))
                return c;

            if (c.getNumArguments() == 0)
                return createConstant (c.context, Value::zeroInitialiser (c.targetType));

            if (auto list = cast<AST::CommaSeparatedList> (c.source))
                return convertExpressionListToConstant (c, c.targetType, *list);

            if (AST::isResolvedAsValue (c.source.get()) && c.source->getResultType().isIdentical (c.targetType))
                return c.source;

            if (auto cv = c.source->getAsConstant())
            {
                auto castValue = cv->value.tryCastToType (c.targetType);

                if (castValue.isValid())
                    return allocator.allocate<AST::Constant> (c.context, castValue);
            }

            return c;
        }